

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.hpp
# Opt level: O2

State * __thiscall
Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
          (UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *this,
          SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *s,
          Control<float> *u)

{
  bool bVar1;
  undefined8 local_34;
  undefined4 local_2c;
  
  bVar1 = UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::computeSigmaPoints
                    ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this);
  if (bVar1) {
    UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>>::
    computeStatePrediction<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
              ((UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>> *)&local_34,
               (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *)this
               ,(Control<float> *)s);
    *(undefined4 *)(this + 8) = local_2c;
    *(undefined8 *)this = local_34;
    UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::
    computeCovarianceFromSigmaPoints<KalmanExamples::Robot1::State<float>_>
              ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)this,
               (State<float> *)this,
               (SigmaPoints<KalmanExamples::Robot1::State<float>_> *)(this + 0x44),
               &(s->super_StandardBase<KalmanExamples::Robot1::State<float>_>).P,
               (Covariance<KalmanExamples::Robot1::State<float>_> *)(this + 0xac));
    return (State *)this;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/include/kalman/UnscentedKalmanFilter.hpp"
                ,0x87,
                "const State &Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::predict(const SystemModelType<Control, CovarianceBase> &, const Control &) [StateType = KalmanExamples::Robot1::State<float>, Control = KalmanExamples::Robot1::Control<float>, CovarianceBase = Kalman::StandardBase]"
               );
}

Assistant:

const State& predict( const SystemModelType<Control, CovarianceBase>& s, const Control& u )
        {
            // Compute sigma points
            if(!computeSigmaPoints())
            {
                // TODO: handle numerical error
                assert(false);
            }
            
            // Compute predicted state
            x = this->template computeStatePrediction<Control, CovarianceBase>(s, u);
            
            // Compute predicted covariance
            computeCovarianceFromSigmaPoints(x, sigmaStatePoints, s.getCovariance(), P);
            
            // Return predicted state
            return this->getState();
        }